

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O3

void QTimer::singleShot(nanoseconds ns,TimerType timerType,QObject *receiver,char *member)

{
  QSingleShotTimer *this;
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  storage_type *in_stack_ffffffffffffff88;
  QByteArray local_70;
  QMessageLogger local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (ns.__r < 0) {
    local_58.context.version = 2;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning
              (&local_58,
               "QTimer::singleShot: negative intervals aren\'t allowed; the interval will be set to 1ms."
              );
    ns.__r = 1000000;
    if (receiver == (QObject *)0x0 || member == (char *)0x0) goto LAB_002c8efd;
  }
  else {
    if (receiver == (QObject *)0x0 || member == (char *)0x0) goto LAB_002c8efd;
    if (ns.__r == 0) {
      pcVar1 = strchr(member,0x28);
      if ((pcVar1 == (char *)0x0) || (2 < (byte)(*member - 0x30U))) {
        singleShot();
      }
      else {
        QVar2.m_data = in_stack_ffffffffffffff88;
        QVar2.m_size = 0x2c8f55;
        QVar2 = QtPrivate::trimmed(QVar2);
        QByteArray::QByteArray(&local_70,QVar2.m_data,QVar2.m_size);
        if (local_70.d.ptr == (char *)0x0) {
          local_70.d.ptr = &QByteArray::_empty;
        }
        local_58.context.version = 0;
        local_58.context.line = 0;
        local_58.context.file._0_4_ = 0;
        local_58.context.file._4_4_ = 0;
        local_58.context.function._0_4_ = 0;
        local_58.context.function._4_4_ = 0;
        QMetaObject::invokeMethodImpl
                  (receiver,local_70.d.ptr,QueuedConnection,1,(void **)&local_58,
                   &local_58.context.file,(QMetaTypeInterface **)&local_58.context.function);
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      goto LAB_002c8efd;
    }
  }
  this = (QSingleShotTimer *)operator_new(0x18);
  QSingleShotTimer::QSingleShotTimer(this,(Duration)ns.__r,timerType,receiver,member);
LAB_002c8efd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimer::singleShot(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                        const QObject *receiver, const char *member)
{
    if (ns < 0ns) {
        qWarning("QTimer::singleShot: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        ns = 1ms;
    }
    if (receiver && member) {
        if (ns == 0ns) {
            // special code shortpath for 0-timers
            const char* bracketPosition = strchr(member, '(');
            if (!bracketPosition || !(member[0] >= '0' && member[0] <= '2')) {
                qWarning("QTimer::singleShot: Invalid slot specification");
                return;
            }
            const auto methodName = QByteArrayView(member + 1, // extract method name
                                                   bracketPosition - 1 - member).trimmed();
            QMetaObject::invokeMethod(const_cast<QObject *>(receiver), methodName.toByteArray().constData(),
                                      Qt::QueuedConnection);
            return;
        }
        (void) new QSingleShotTimer(ns, timerType, receiver, member);
    }
}